

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall jsonip::detail::struct_helper<A>::struct_helper(struct_helper<A> *this)

{
  initializer local_18;
  struct_helper<A> *local_10;
  struct_helper<A> *this_local;
  
  local_10 = this;
  struct_helper_base::struct_helper_base(&this->super_struct_helper_base);
  (this->super_struct_helper_base).super_helper._vptr_helper =
       (_func_int **)&PTR__struct_helper_00139b20;
  initializer::initializer(&local_18,this);
  boost::mpl::for_each<boost::mpl::range_c<int,0,1>,jsonip::detail::struct_helper<A>::initializer>
            (local_18,(range_c<int,_0,_1> *)0x0);
  return;
}

Assistant:

struct_helper()
        {
            boost::mpl::for_each<range_t>(initializer(*this));
        }